

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtree.c
# Opt level: O2

rb_result_t rb_tree_remove(rb_tree *tree,rb_tree_node *node)

{
  int iVar1;
  rb_tree_node *prVar2;
  rb_tree_node *prVar3;
  rb_tree_node *prVar4;
  rb_tree_node *yp;
  rb_tree_node *prVar5;
  rb_tree_node *prVar6;
  rb_tree_node *prVar7;
  rb_tree *prVar8;
  bool bVar9;
  
  if (tree == (rb_tree *)0x0) {
    __assert_fail("\"tree != NULL\" && 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/monkey[P]monkey/deps/rbtree/rbtree.c"
                  ,0x2ad,"rb_result_t rb_tree_remove(struct rb_tree *, struct rb_tree_node *)");
  }
  if (node == (rb_tree_node *)0x0) {
    __assert_fail("\"node != NULL\" && 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/monkey[P]monkey/deps/rbtree/rbtree.c"
                  ,0x2ae,"rb_result_t rb_tree_remove(struct rb_tree *, struct rb_tree_node *)");
  }
  prVar3 = node->left;
  prVar7 = node;
  if (prVar3 == (rb_tree_node *)0x0) {
    prVar4 = node;
    if (tree->rightmost == node) {
      do {
        prVar6 = prVar4->parent;
        if (prVar6 == (rb_tree_node *)0x0) {
          prVar6 = (rb_tree_node *)0x0;
          break;
        }
        bVar9 = prVar4 == prVar6->left;
        prVar4 = prVar6;
      } while (bVar9);
LAB_00112ff4:
      tree->rightmost = prVar6;
    }
    if (prVar3 != (rb_tree_node *)0x0) goto LAB_00113008;
LAB_00112fff:
    prVar3 = prVar7->right;
    if (prVar3 != (rb_tree_node *)0x0) goto LAB_00113008;
    prVar4 = prVar7->parent;
    prVar3 = (rb_tree_node *)0x0;
  }
  else {
    prVar4 = node->right;
    if (node->right != (rb_tree_node *)0x0) {
      do {
        prVar7 = prVar4;
        prVar4 = prVar7->left;
      } while (prVar7->left != (rb_tree_node *)0x0);
      goto LAB_00112fff;
    }
    prVar4 = prVar3;
    if (tree->rightmost == node) {
      do {
        prVar6 = prVar4;
        prVar4 = prVar6->right;
      } while (prVar6->right != (rb_tree_node *)0x0);
      goto LAB_00112ff4;
    }
LAB_00113008:
    prVar4 = prVar7->parent;
    prVar3->parent = prVar4;
  }
  bVar9 = false;
  prVar8 = tree;
  if (prVar4 != (rb_tree_node *)0x0) {
    bVar9 = prVar7 == prVar4->left;
    prVar8 = (rb_tree *)(&prVar4->left + !bVar9);
  }
  prVar8->root = prVar3;
  iVar1 = prVar7->color;
  if (prVar7 == node) goto LAB_001130a3;
  prVar6 = node->left;
  prVar5 = node->right;
  prVar2 = node->parent;
  prVar7->parent = prVar2;
  if (prVar2 == (rb_tree_node *)0x0) {
    prVar8 = tree;
    if (tree->root == node) goto LAB_00113062;
  }
  else {
    prVar8 = (rb_tree *)(&prVar2->left + (prVar2->left != node));
LAB_00113062:
    prVar8->root = prVar7;
  }
  prVar7->right = prVar5;
  if (prVar5 != (rb_tree_node *)0x0) {
    prVar5->parent = prVar7;
  }
  node->right = (rb_tree_node *)0x0;
  prVar7->left = prVar6;
  if (prVar6 != (rb_tree_node *)0x0) {
    prVar6->parent = prVar7;
  }
  node->left = (rb_tree_node *)0x0;
  prVar7->color = node->color;
  node->parent = (rb_tree_node *)0x0;
  if (prVar4 == node) {
    prVar4 = prVar7;
  }
LAB_001130a3:
  if (iVar1 != 0) {
LAB_00113209:
    node->left = (rb_tree_node *)0x0;
    node->right = (rb_tree_node *)0x0;
    node->parent = (rb_tree_node *)0x0;
    return 0;
  }
LAB_001130ab:
  prVar6 = prVar4;
  prVar7 = prVar6;
  if (bVar9) {
    prVar7 = (rb_tree_node *)&prVar6->right;
  }
  do {
    if (prVar3 == tree->root) {
      if (prVar3 != (rb_tree_node *)0x0) {
LAB_00113205:
        prVar3->color = 0;
      }
      goto LAB_00113209;
    }
    if ((prVar3 != (rb_tree_node *)0x0) && (prVar3->color != 0)) goto LAB_00113205;
    prVar3 = prVar7->left;
    if (prVar3 == (rb_tree_node *)0x0) goto LAB_001131d5;
    if (prVar3->color == 1) {
      prVar3->color = 0;
      prVar6->color = 1;
      if (bVar9) {
        __helper_rotate_left(tree,prVar6);
      }
      else {
        __helper_rotate_right(tree,prVar6);
      }
      prVar3 = prVar7->left;
      if (prVar3 == (rb_tree_node *)0x0) goto LAB_001131d5;
    }
    prVar4 = prVar3->left;
    prVar5 = prVar3->right;
    if ((prVar4 == (rb_tree_node *)0x0) || (prVar4->color == 0)) {
      if ((prVar5 == (rb_tree_node *)0x0) || (prVar5->color == 0)) break;
      if ((!bVar9) && ((prVar4 == (rb_tree_node *)0x0 || (prVar4->color == 0)))) {
        prVar3->color = 1;
        prVar5->color = 0;
        __helper_rotate_left(tree,prVar3);
        prVar3 = prVar6;
        goto LAB_0011317e;
      }
    }
    else if ((bVar9) && ((prVar5 == (rb_tree_node *)0x0 || (prVar5->color == 0)))) {
      prVar3->color = 1;
      prVar4->color = 0;
      __helper_rotate_right(tree,prVar3);
      prVar3 = (rb_tree_node *)&prVar6->right;
LAB_0011317e:
      prVar3 = prVar3->left;
      prVar4 = prVar3->left;
      prVar5 = prVar3->right;
    }
    prVar3->color = prVar6->color;
    prVar6->color = 0;
    if ((bVar9) && (prVar5 != (rb_tree_node *)0x0)) {
      prVar5->color = 0;
      __helper_rotate_left(tree,prVar6);
    }
    else if ((!bVar9) && (prVar4 != (rb_tree_node *)0x0)) {
      prVar4->color = 0;
      __helper_rotate_right(tree,prVar6);
    }
    prVar3 = tree->root;
  } while( true );
  prVar3->color = 1;
LAB_001131d5:
  prVar7 = prVar6->parent;
  bVar9 = false;
  prVar3 = prVar6;
  prVar4 = (rb_tree_node *)0x0;
  if (prVar7 != (rb_tree_node *)0x0) {
    bVar9 = prVar6 == prVar7->left;
    prVar4 = prVar7;
  }
  goto LAB_001130ab;
}

Assistant:

rb_result_t rb_tree_remove(struct rb_tree *tree,
                           struct rb_tree_node *node)
{
    rb_result_t ret = RB_OK;

    RB_ASSERT_ARG(tree != NULL);
    RB_ASSERT_ARG(node != NULL);

    struct rb_tree_node *y;


    if (node->left == NULL || node->right == NULL) {
        y = node;
        if (node == tree->rightmost) {
            /* The new rightmost item is our successor */
            tree->rightmost = __helper_rb_tree_find_predecessor(node);
        }
    } else {
        y = __helper_rb_tree_find_successor(node);
    }

    struct rb_tree_node *x, *xp;

    if (y->left != NULL) {
        x = y->left;
    } else {
        x = y->right;
    }

    if (x != NULL) {
        x->parent = y->parent;
        xp = x->parent;
    } else {
        xp = y->parent;
    }

    int is_left = 0;
    if (y->parent == NULL) {
        tree->root = x;
        xp = NULL;
    } else {
        struct rb_tree_node *yp = y->parent;
        if (y == yp->left) {
            yp->left = x;
            is_left = 1;
        } else {
            yp->right = x;
            is_left = 0;
        }
    }

    int y_color = y->color;

    /* Swap in the node */
    if (y != node) {
        __helper_rb_tree_swap_node(tree, node, y);
        if (xp == node) {
            xp = y;
        }
    }

    if (y_color == COLOR_BLACK) {
        __helper_rb_tree_delete_rebalance(tree, x, xp, is_left);
    }

    node->parent = NULL;
    node->left = NULL;
    node->right = NULL;

    return ret;
}